

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_sqrt_arm(float64 xa,float_status *s)

{
  float64 fVar1;
  bool bVar2;
  double dVar3;
  int local_5c;
  int local_50;
  union_float64 ur;
  union_float64 ua;
  float_status *s_local;
  float64 xa_local;
  float_status *local_20;
  float_status *local_18;
  union_float64 *local_10;
  
  bVar2 = false;
  if ((s->float_exception_flags & 0x20) != 0) {
    bVar2 = s->float_rounding_mode == '\0';
  }
  ur.s = xa;
  ua = (union_float64)s;
  s_local = (float_status *)xa;
  local_20 = s;
  if (!bVar2) goto LAB_0059e090;
  local_10 = &ur;
  local_18 = s;
  if (s->flush_inputs_to_zero != '\0') {
    float64_input_flush__nocheck(&local_10->s,s);
  }
  local_50 = 2;
  if (((ur.h != 0.0) || (NAN(ur.h))) && (local_50 = 0, !NAN(ur.h))) {
    dVar3 = ABS(ur.h);
    local_50 = 1;
    if (((dVar3 != INFINITY) || (NAN(dVar3))) && (local_50 = 3, 2.2250738585072014e-308 <= dVar3)) {
      local_50 = 4;
    }
  }
  if (local_50 == 4) {
LAB_0059dfe8:
    bVar2 = (long)ur.s < 0;
  }
  else {
    local_5c = 2;
    if (((ur.h != 0.0) || (NAN(ur.h))) && (local_5c = 0, !NAN(ur.h))) {
      dVar3 = ABS(ur.h);
      local_5c = 1;
      if (((dVar3 != INFINITY) || (NAN(dVar3))) && (local_5c = 3, 2.2250738585072014e-308 <= dVar3))
      {
        local_5c = 4;
      }
    }
    bVar2 = true;
    if (local_5c == 2) goto LAB_0059dfe8;
  }
  if (!bVar2) {
    dVar3 = sqrt(ur.h);
    return (float64)dVar3;
  }
LAB_0059e090:
  fVar1 = soft_f64_sqrt(ur.s,ua.s);
  return fVar1;
}

Assistant:

float64 QEMU_FLATTEN float64_sqrt(float64 xa, float_status *s)
{
    union_float64 ua, ur;

    ua.s = xa;
    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float64_input_flush1(&ua.s, s);
    if (QEMU_HARDFLOAT_1F64_USE_FP) {
        if (unlikely(!(fpclassify(ua.h) == FP_NORMAL ||
                       fpclassify(ua.h) == FP_ZERO) ||
                     signbit(ua.h))) {
            goto soft;
        }
    } else if (unlikely(!float64_is_zero_or_normal(ua.s) ||
                        float64_is_neg(ua.s))) {
        goto soft;
    }
    ur.h = sqrt(ua.h);
    return ur.s;

 soft:
    return soft_f64_sqrt(ua.s, s);
}